

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

MessageSizeCounts
capnp::_::WireHelpers::totalSize(SegmentReader *segment,WirePointer *ref,int nestingLimit)

{
  WirePointer *pWVar1;
  ushort uVar2;
  word *pwVar3;
  Arena *pAVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  char *condition;
  ulong uVar13;
  WirePointer *pWVar14;
  ulong uVar15;
  WirePointer *pWVar16;
  bool bVar17;
  MessageSizeCounts MVar18;
  Fault f;
  
  uVar9 = (ref->offsetAndKind).value;
  if ((ref->field_1).upper32Bits != 0 || uVar9 != 0) {
    if (nestingLimit < 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[30]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x301,FAILED,"nestingLimit > 0","\"Message is too deeply-nested.\"",
                 (char (*) [30])"Message is too deeply-nested.");
    }
    else {
      iVar11 = nestingLimit + -1;
      pWVar14 = ref + 1;
      lVar10 = (long)((int)uVar9 >> 2);
      if (segment == (SegmentReader *)0x0) {
        pWVar16 = pWVar14 + lVar10;
        segment = (SegmentReader *)0x0;
        switch(uVar9 & 3) {
        case 0:
          goto switchD_0019c668_caseD_0;
        case 1:
switchD_0019c668_caseD_1:
          uVar9 = (ref->field_1).upper32Bits;
          uVar8 = (ulong)(uVar9 & 7);
          switch(uVar9 & 7) {
          case 0:
            uVar13 = uVar8;
            goto LAB_0019c7fa;
          default:
            uVar13 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + uVar8 * 4) * (ulong)(uVar9 >> 3) +
                     0x3f >> 6;
            uVar8 = 0;
            if (segment == (SegmentReader *)0x0) goto LAB_0019c7fa;
            uVar12 = uVar13 & 0xffffffff;
            if (((long)pWVar16 - (long)(segment->ptr).ptr >> 3) + uVar12 <= (segment->ptr).size_) {
              uVar15 = segment->readLimiter->limit;
              if (uVar12 <= uVar15) {
                segment->readLimiter->limit = uVar15 - uVar12;
                goto LAB_0019c7fa;
              }
              (*segment->arena->_vptr_Arena[3])();
            }
            condition = "boundsCheck(segment, ptr, totalWords)";
            iVar11 = 0x32a;
            break;
          case 6:
            if (segment == (SegmentReader *)0x0) {
LAB_0019c991:
              uVar13 = (ulong)(uVar9 >> 3);
              uVar8 = 0;
              uVar12 = uVar13;
              while (bVar17 = uVar12 != 0, uVar12 = uVar12 - 1, bVar17) {
                MVar18 = totalSize(segment,pWVar16,iVar11);
                uVar13 = uVar13 + MVar18.wordCount;
                uVar8 = (ulong)((int)uVar8 + MVar18.capCount);
                pWVar16 = pWVar16 + 1;
              }
              goto LAB_0019c7fa;
            }
            uVar13 = (ulong)(uVar9 >> 3);
            if (((long)pWVar16 - (long)(segment->ptr).ptr >> 3) + uVar13 <= (segment->ptr).size_) {
              uVar8 = segment->readLimiter->limit;
              if (uVar13 <= uVar8) {
                segment->readLimiter->limit = uVar8 - uVar13;
                goto LAB_0019c991;
              }
              (*segment->arena->_vptr_Arena[3])();
            }
            condition = "boundsCheck(segment, ptr, count * WORDS_PER_POINTER)";
            iVar11 = 0x334;
            break;
          case 7:
            uVar8 = (ulong)(uVar9 >> 3);
            if (segment == (SegmentReader *)0x0) {
LAB_0019c8b1:
              uVar9 = (pWVar16->offsetAndKind).value;
              if ((uVar9 & 3) == 0) {
                uVar9 = uVar9 >> 2 & 0x1fffffff;
                uVar12 = (ulong)(pWVar16->field_1).structRef.dataSize.value;
                uVar2 = (pWVar16->field_1).structRef.ptrCount.value;
                uVar13 = (uVar2 + uVar12) * (ulong)uVar9;
                if (uVar13 < uVar8 || uVar13 - uVar8 == 0) {
                  uVar13 = uVar13 + 1;
                  uVar8 = 0;
                  if (uVar2 != 0) {
                    pWVar16 = pWVar16 + 1;
                    uVar8 = 0;
                    for (uVar7 = 0; uVar7 != uVar9; uVar7 = uVar7 + 1) {
                      pWVar16 = pWVar16 + uVar12;
                      uVar15 = (ulong)uVar2;
                      while (iVar6 = (int)uVar15, uVar15 = (ulong)(iVar6 - 1), iVar6 != 0) {
                        MVar18 = totalSize(segment,pWVar16,iVar11);
                        uVar13 = uVar13 + MVar18.wordCount;
                        uVar8 = (ulong)((int)uVar8 + MVar18.capCount);
                        pWVar16 = pWVar16 + 1;
                      }
                    }
                  }
                  goto LAB_0019c7fa;
                }
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                          (&f,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x352,FAILED,"actualSize <= wordCount",
                           "\"Struct list pointer\'s elements overran size.\"",
                           (char (*) [45])"Struct list pointer\'s elements overran size.");
              }
              else {
                kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                          (&f,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x34b,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                           "\"Don\'t know how to handle non-STRUCT inline composite.\"",
                           (char (*) [54])"Don\'t know how to handle non-STRUCT inline composite.");
              }
              goto LAB_0019c76a;
            }
            if (((long)pWVar16 - (long)(segment->ptr).ptr >> 3) + uVar8 + 1 <= (segment->ptr).size_)
            {
              uVar13 = segment->readLimiter->limit;
              if (uVar8 + 1 <= uVar13) {
                segment->readLimiter->limit = uVar13 - (uVar8 + 1);
                goto LAB_0019c8b1;
              }
              (*segment->arena->_vptr_Arena[3])();
            }
            condition = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
            iVar11 = 0x343;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[46]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar11,FAILED,condition,"\"Message contained out-of-bounds list pointer.\"",
                     (char (*) [46])"Message contained out-of-bounds list pointer.");
          break;
        case 2:
switchD_0019c668_caseD_2:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x36f,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
                     (char (*) [24])"Unexpected FAR pointer.");
          break;
        case 3:
switchD_0019c668_caseD_3:
          uVar13 = 0;
          if (uVar9 == 3) {
            uVar8 = 1;
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x377,FAILED,(char *)0x0,"\"Unknown pointer type.\"",
                       (char (*) [22])"Unknown pointer type.");
            kj::_::Debug::Fault::~Fault(&f);
            uVar8 = 0;
          }
          goto LAB_0019c7fa;
        }
      }
      else {
        pwVar3 = (segment->ptr).ptr;
        pWVar1 = (WirePointer *)(pwVar3 + (segment->ptr).size_);
        pWVar16 = pWVar14 + lVar10;
        if ((long)pWVar1 - (long)pWVar14 >> 3 < lVar10) {
          pWVar16 = pWVar1;
        }
        if (lVar10 < (long)pwVar3 - (long)pWVar14 >> 3) {
          pWVar16 = pWVar1;
        }
        if ((uVar9 & 3) == 2) {
          iVar6 = (*segment->arena->_vptr_Arena[2])();
          segment = (SegmentReader *)CONCAT44(extraout_var,iVar6);
          if (segment == (SegmentReader *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x234,FAILED,"segment != nullptr",
                       "\"Message contains far pointer to unknown segment.\"",
                       (char (*) [49])"Message contains far pointer to unknown segment.");
          }
          else {
            uVar13 = (segment->ptr).size_;
            uVar9 = (ref->offsetAndKind).value;
            uVar8 = (ulong)(uVar9 >> 3);
            if ((long)uVar13 < (long)(ulong)(uVar9 >> 3)) {
              uVar8 = uVar13;
            }
            uVar12 = 2 - (ulong)((uVar9 & 4) == 0);
            if (uVar8 + uVar12 <= uVar13) {
              pwVar3 = (segment->ptr).ptr;
              pAVar4 = segment->arena;
              uVar15 = segment->readLimiter->limit;
              if (uVar12 <= uVar15) {
                pWVar14 = (WirePointer *)(pwVar3 + uVar8);
                ref = pWVar14 + 1;
                segment->readLimiter->limit = uVar15 - uVar12;
                if ((uVar9 & 4) == 0) {
                  uVar9 = (pWVar14->offsetAndKind).value;
                  lVar10 = (long)((int)uVar9 >> 2);
                  pWVar16 = (WirePointer *)(pwVar3 + uVar13);
                  if (((long)pwVar3 - (long)ref >> 3 <= lVar10) &&
                     (lVar10 <= (long)pWVar16 - (long)ref >> 3)) {
                    pWVar16 = ref + lVar10;
                    ref = pWVar14;
                    switch(uVar9 & 3) {
                    case 1:
                      goto switchD_0019c668_caseD_1;
                    case 2:
                      goto switchD_0019c668_caseD_2;
                    case 3:
                      goto switchD_0019c668_caseD_3;
                    }
                    goto switchD_0019c668_caseD_0;
                  }
                  goto LAB_0019c6d5;
                }
                iVar6 = (*pAVar4->_vptr_Arena[2])(pAVar4,(ulong)(pWVar14->field_1).upper32Bits);
                segment = (SegmentReader *)CONCAT44(extraout_var_00,iVar6);
                if (segment == (SegmentReader *)0x0) {
                  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                            (&f,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x24e,FAILED,"newSegment != nullptr",
                             "\"Message contains double-far pointer to unknown segment.\"",
                             (char (*) [56])
                             "Message contains double-far pointer to unknown segment.");
                }
                else {
                  uVar9 = (pWVar14->offsetAndKind).value;
                  if ((uVar9 & 3) == 2) {
                    uVar13 = (ulong)(uVar9 >> 3);
                    sVar5 = (segment->ptr).size_;
                    if ((long)sVar5 < (long)uVar13) {
                      uVar13 = sVar5;
                    }
                    pWVar16 = (WirePointer *)((segment->ptr).ptr + uVar13);
                    goto LAB_0019c6c9;
                  }
                  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                            (&f,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
                             "\"Second word of double-far pad must be far pointer.\"",
                             (char (*) [51])"Second word of double-far pad must be far pointer.");
                }
                goto LAB_0019c76a;
              }
              (*pAVar4->_vptr_Arena[3])();
            }
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
                       "\"Message contains out-of-bounds far pointer.\"",
                       (char (*) [44])"Message contains out-of-bounds far pointer.");
          }
        }
        else {
LAB_0019c6c9:
          pWVar14 = ref;
          if (pWVar16 == (WirePointer *)0x0) goto LAB_0019c7f7;
LAB_0019c6d5:
          uVar9 = (pWVar14->offsetAndKind).value;
          ref = pWVar14;
          switch(uVar9 & 3) {
          case 1:
            goto switchD_0019c668_caseD_1;
          case 2:
            goto switchD_0019c668_caseD_2;
          case 3:
            goto switchD_0019c668_caseD_3;
          }
switchD_0019c668_caseD_0:
          uVar8 = (ulong)(ref->field_1).structRef.dataSize.value;
          uVar12 = (ulong)(ref->field_1).structRef.ptrCount.value;
          if (segment == (SegmentReader *)0x0) {
LAB_0019c84e:
            uVar13 = uVar8 + uVar12;
            pWVar16 = pWVar16 + uVar8;
            uVar8 = 0;
            while (bVar17 = uVar12 != 0, uVar12 = uVar12 - 1, bVar17) {
              MVar18 = totalSize(segment,pWVar16,iVar11);
              uVar13 = uVar13 + MVar18.wordCount;
              uVar8 = (ulong)((int)uVar8 + MVar18.capCount);
              pWVar16 = pWVar16 + 1;
            }
            goto LAB_0019c7fa;
          }
          uVar13 = uVar8 + uVar12;
          if (((long)pWVar16 - (long)(segment->ptr).ptr >> 3) + uVar13 <= (segment->ptr).size_) {
            uVar15 = segment->readLimiter->limit;
            if (uVar13 <= uVar15) {
              segment->readLimiter->limit = uVar15 - uVar13;
              goto LAB_0019c84e;
            }
            (*segment->arena->_vptr_Arena[3])();
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x310,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                     "\"Message contained out-of-bounds struct pointer.\"",
                     (char (*) [48])"Message contained out-of-bounds struct pointer.");
        }
      }
    }
LAB_0019c76a:
    kj::_::Debug::Fault::~Fault(&f);
  }
LAB_0019c7f7:
  uVar8 = 0;
  uVar13 = 0;
LAB_0019c7fa:
  MVar18._8_8_ = uVar8;
  MVar18.wordCount = uVar13;
  return MVar18;
}

Assistant:

static MessageSizeCounts totalSize(
      SegmentReader* segment, const WirePointer* ref, int nestingLimit) {
    // Compute the total size of the object pointed to, not counting far pointer overhead.

    MessageSizeCounts result = { ZERO * WORDS, 0 };

    if (ref->isNull()) {
      return result;
    }

    KJ_REQUIRE(nestingLimit > 0, "Message is too deeply-nested.") {
      return result;
    }
    --nestingLimit;

    const word* ptr;
    KJ_IF_MAYBE(p, followFars(ref, ref->target(segment), segment)) {
      ptr = p;
    } else {
      return result;
    }

    switch (ref->kind()) {
      case WirePointer::STRUCT: {
        KJ_REQUIRE(boundsCheck(segment, ptr, ref->structRef.wordSize()),
                   "Message contained out-of-bounds struct pointer.") {
          return result;
        }
        result.addWords(ref->structRef.wordSize());

        const WirePointer* pointerSection =
            reinterpret_cast<const WirePointer*>(ptr + ref->structRef.dataSize.get());
        for (auto i: kj::zeroTo(ref->structRef.ptrCount.get())) {
          result += totalSize(segment, pointerSection + i, nestingLimit);
        }
        break;
      }
      case WirePointer::LIST: {
        switch (ref->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto totalWords = roundBitsUpToWords(
                upgradeBound<uint64_t>(ref->listRef.elementCount()) *
                dataBitsPerElement(ref->listRef.elementSize()));
            KJ_REQUIRE(boundsCheck(segment, ptr, totalWords),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }
            result.addWords(totalWords);
            break;
          }
          case ElementSize::POINTER: {
            auto count = ref->listRef.elementCount() * (POINTERS / ELEMENTS);

            KJ_REQUIRE(boundsCheck(segment, ptr, count * WORDS_PER_POINTER),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }

            result.addWords(count * WORDS_PER_POINTER);

            for (auto i: kj::zeroTo(count)) {
              result += totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                  nestingLimit);
            }
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            auto wordCount = ref->listRef.inlineCompositeWordCount();
            KJ_REQUIRE(boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS),
                       "Message contained out-of-bounds list pointer.") {
              return result;
            }

            const WirePointer* elementTag = reinterpret_cast<const WirePointer*>(ptr);
            auto count = elementTag->inlineCompositeListElementCount();

            KJ_REQUIRE(elementTag->kind() == WirePointer::STRUCT,
                       "Don't know how to handle non-STRUCT inline composite.") {
              return result;
            }

            auto actualSize = elementTag->structRef.wordSize() / ELEMENTS *
                              upgradeBound<uint64_t>(count);
            KJ_REQUIRE(actualSize <= wordCount,
                       "Struct list pointer's elements overran size.") {
              return result;
            }

            // We count the actual size rather than the claimed word count because that's what
            // we'll end up with if we make a copy.
            result.addWords(actualSize + POINTER_SIZE_IN_WORDS);

            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            if (pointerCount > ZERO * POINTERS) {
              const word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  result += totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                      nestingLimit);
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        if (ref->isCapability()) {
          result.capCount++;
        } else {
          KJ_FAIL_REQUIRE("Unknown pointer type.") { break; }
        }
        break;
    }

    return result;
  }